

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O1

void __thiscall
soplex::
LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPRowBase(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_lhs,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *p_rowVector,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *p_rhs,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_obj)

{
  int32_t iVar1;
  long lVar2;
  uint *puVar3;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  
  puVar3 = (uint *)p_lhs;
  pLVar4 = this;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pLVar4->left).m_backend.data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pLVar4 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((pLVar4->left).m_backend.data._M_elems + 1);
  }
  (this->left).m_backend.exp = (p_lhs->m_backend).exp;
  (this->left).m_backend.neg = (p_lhs->m_backend).neg;
  iVar1 = (p_lhs->m_backend).prec_elem;
  (this->left).m_backend.fpclass = (p_lhs->m_backend).fpclass;
  (this->left).m_backend.prec_elem = iVar1;
  puVar3 = (uint *)p_rhs;
  pnVar5 = &this->right;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
  }
  (this->right).m_backend.exp = (p_rhs->m_backend).exp;
  (this->right).m_backend.neg = (p_rhs->m_backend).neg;
  iVar1 = (p_rhs->m_backend).prec_elem;
  (this->right).m_backend.fpclass = (p_rhs->m_backend).fpclass;
  (this->right).m_backend.prec_elem = iVar1;
  puVar3 = (uint *)p_obj;
  pnVar5 = &this->object;
  for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pnVar5->m_backend).data._M_elems[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
  }
  (this->object).m_backend.exp = (p_obj->m_backend).exp;
  (this->object).m_backend.neg = (p_obj->m_backend).neg;
  iVar1 = (p_obj->m_backend).prec_elem;
  (this->object).m_backend.fpclass = (p_obj->m_backend).fpclass;
  (this->object).m_backend.prec_elem = iVar1;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->vec)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
  (this->vec).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->vec,p_rowVector->memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->vec).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,p_rowVector);
  return;
}

Assistant:

LPRowBase(const R& p_lhs, const SVectorBase<R>& p_rowVector, const R& p_rhs, const R& p_obj = 0)
      : left(p_lhs), right(p_rhs), object(p_obj), vec(p_rowVector)
   {
      assert(isConsistent());
   }